

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodebuild.cpp
# Opt level: O2

void __thiscall FNodeBuilder::RemoveSegFromVert1(FNodeBuilder *this,DWORD segnum,int vertnum)

{
  FPrivVert *pFVar1;
  FPrivSeg *pFVar2;
  uint uVar3;
  ulong uVar4;
  
  pFVar1 = (this->Vertices).Array;
  uVar3 = pFVar1[vertnum].segs;
  if (uVar3 == segnum) {
    pFVar1[vertnum].segs = (this->Segs).Array[segnum].nextforvert;
    return;
  }
  pFVar2 = (this->Segs).Array;
  uVar4 = 0;
  for (; (uVar3 != 0xffffffff && (uVar3 != segnum)); uVar3 = pFVar2[uVar3].nextforvert) {
    uVar4 = (ulong)uVar3;
  }
  if (uVar3 == segnum) {
    pFVar2[uVar4].nextforvert = pFVar2[segnum].nextforvert;
  }
  return;
}

Assistant:

void FNodeBuilder::RemoveSegFromVert1 (DWORD segnum, int vertnum)
{
	FPrivVert *v = &Vertices[vertnum];

	if (v->segs == segnum)
	{
		v->segs = Segs[segnum].nextforvert;
	}
	else
	{
		DWORD prev, curr;
		prev = 0;
		curr = v->segs;
		while (curr != DWORD_MAX && curr != segnum)
		{
			prev = curr;
			curr = Segs[curr].nextforvert;
		}
		if (curr == segnum)
		{
			Segs[prev].nextforvert = Segs[curr].nextforvert;
		}
	}
}